

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
calculator::NegateTypeException::NegateTypeException(NegateTypeException *this,double x)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError = &PTR__SyntaxError_00116860;
  std::__cxx11::to_string(&local_50,x);
  std::operator+(&local_30,"Error: can not negate double/float type: ",&local_50);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_30
            );
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

NegateTypeException(double x) {
        error_msg =
            "Error: can not negate double/float type: " + std::to_string(x);
    }